

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

xmlChar * xmlStrsub(xmlChar *str,int start,int len)

{
  xmlChar *pxVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (-1 < (len | start) && str != (xmlChar *)0x0) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)start;
    if (start < 1) {
      uVar3 = uVar2;
    }
    for (; (int)uVar3 != (int)uVar2; uVar2 = uVar2 + 1) {
      if (str[uVar2] == '\0') {
        return (xmlChar *)0x0;
      }
    }
    if (str[uVar3] != '\0') {
      pxVar1 = xmlStrndup(str + uVar3,len);
      return pxVar1;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlStrsub(const xmlChar *str, int start, int len) {
    int i;

    if (str == NULL) return(NULL);
    if (start < 0) return(NULL);
    if (len < 0) return(NULL);

    for (i = 0;i < start;i++) {
        if (*str == 0) return(NULL);
        str++;
    }
    if (*str == 0) return(NULL);
    return(xmlStrndup(str, len));
}